

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

cmFortranSourceInfo * __thiscall
cmDependsFortranInternals::CreateObjectInfo(cmDependsFortranInternals *this,char *obj,char *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_bool>
  pVar5;
  value_type entry;
  char *local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  local_1b0;
  cmFortranSourceInfo local_e0;
  
  local_1b8 = obj;
  std::__cxx11::string::string((string *)&local_1b0,obj,(allocator *)&local_e0);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
          ::find(&(this->ObjectInfo)._M_t,&local_1b0.first);
  paVar1 = &local_1b0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b0.first._M_dataplus._M_p,
                    local_1b0.first.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(this->ObjectInfo)._M_t._M_impl.super__Rb_tree_header) {
    memset(&local_e0,0,0xb0);
    paVar2 = &local_e0.Source.field_2;
    local_e0.Source._M_string_length = 0;
    local_e0.Source.field_2._M_local_buf[0] = '\0';
    local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
    local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
    local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
    local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e0.Source._M_dataplus._M_p = (pointer)paVar2;
    local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_e0.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::pair<const_char_*&,_cmFortranSourceInfo,_true>(&local_1b0,&local_1b8,&local_e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_e0.Includes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_e0.Requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_e0.Provides._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.Source._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0.Source._M_dataplus._M_p,
                      CONCAT71(local_e0.Source.field_2._M_allocated_capacity._1_7_,
                               local_e0.Source.field_2._M_local_buf[0]) + 1);
    }
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
                        *)&this->ObjectInfo,&local_1b0);
    iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
    p_Var3 = iVar4._M_node[2]._M_parent;
    strlen(src);
    std::__cxx11::string::_M_replace((ulong)(iVar4._M_node + 2),0,(char *)p_Var3,(ulong)src);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1b0.second.Includes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1b0.second.Requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1b0.second.Provides._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.second.Source._M_dataplus._M_p != &local_1b0.second.Source.field_2) {
      operator_delete(local_1b0.second.Source._M_dataplus._M_p,
                      local_1b0.second.Source.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0.first._M_dataplus._M_p,
                      local_1b0.first.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmFortranSourceInfo *)(iVar4._M_node + 2);
}

Assistant:

cmFortranSourceInfo& CreateObjectInfo(const char* obj, const char* src)
  {
    std::map<std::string, cmFortranSourceInfo>::iterator i =
      this->ObjectInfo.find(obj);
    if (i == this->ObjectInfo.end()) {
      std::map<std::string, cmFortranSourceInfo>::value_type entry(
        obj, cmFortranSourceInfo());
      i = this->ObjectInfo.insert(entry).first;
      i->second.Source = src;
    }
    return i->second;
  }